

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O3

size_t __thiscall
cubeb_resampler_speex_one_way<float>::output
          (cubeb_resampler_speex_one_way<float> *this,float *output_buffer,size_t output_frame_count
          )

{
  size_t *psVar1;
  ulong uVar2;
  float *__dest;
  ulong uVar3;
  uint32_t out_len;
  uint32_t in_len;
  uint local_18;
  uint local_14;
  
  local_14 = (uint)((this->resampling_in_buffer).length_ / (ulong)(this->super_processor).channels);
  local_18 = (uint)output_frame_count;
  speex_resampler_process_interleaved_float
            (this->speex_resampler,(this->resampling_in_buffer).data_,&local_14,output_buffer,
             &local_18);
  uVar3 = (ulong)(this->super_processor).channels * (ulong)local_14;
  uVar2 = (this->resampling_in_buffer).length_;
  if ((uVar3 <= uVar2) && (__dest = (this->resampling_in_buffer).data_, __dest != (float *)0x0)) {
    memmove(__dest,__dest + uVar3,(uVar2 - uVar3) * 4);
    psVar1 = &(this->resampling_in_buffer).length_;
    *psVar1 = *psVar1 - uVar3;
  }
  return (ulong)local_18;
}

Assistant:

size_t output(T * output_buffer, size_t output_frame_count)
  {
    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len, output_buffer,
                   &out_len);

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));

    return out_len;
  }